

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O3

int DecodeImageStream(int xsize,int ysize,int is_level0,VP8LDecoder *dec,uint32_t **decoded_data)

{
  VP8LBitReader *br_00;
  uint32_t **decoded_data_00;
  ushort uVar1;
  ushort uVar2;
  HuffmanCode HVar3;
  uint32_t *puVar4;
  HuffmanCode *pHVar5;
  bool bVar6;
  uint32_t uVar7;
  VP8LImageTransformType VVar8;
  int iVar9;
  int iVar10;
  uint32_t uVar11;
  int iVar12;
  uint32_t *puVar13;
  ulong uVar14;
  long lVar15;
  int *code_lengths;
  HuffmanCode *ptr;
  void *__s;
  byte bVar16;
  ulong uVar17;
  ulong uVar18;
  VP8LBitReader *br;
  uint64_t uVar19;
  VP8StatusCode VVar20;
  uint uVar21;
  ulong uVar22;
  HuffmanCode *table;
  uint uVar23;
  VP8LTransform *pVVar24;
  uint64_t nmemb;
  HTreeGroup *local_b8;
  uint32_t *local_88;
  ulong local_80;
  void *local_78;
  uint64_t local_70;
  ulong local_68;
  HTreeGroup *local_60;
  VP8LMetadata *local_58;
  uint32_t *local_50;
  long local_48;
  uint64_t local_40;
  uint32_t **local_38;
  
  br_00 = &dec->br_;
  local_58 = &dec->hdr_;
  local_38 = decoded_data;
  if (is_level0 == 0) {
LAB_0010ff22:
    uVar7 = VP8LReadBits(br_00,1);
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      uVar7 = VP8LReadBits(br_00,4);
      VVar20 = VP8_STATUS_BITSTREAM_ERROR;
      if (10 < uVar7 - 1) goto LAB_0011059c;
    }
    local_88 = (uint32_t *)0x0;
    uVar1 = kTableSize[uVar7];
    if ((is_level0 == 0) || (uVar11 = VP8LReadBits(br_00,1), uVar11 == 0)) {
      nmemb = 1;
      __s = (void *)0x0;
      uVar14 = 1;
    }
    else {
      uVar11 = VP8LReadBits(br_00,3);
      bVar16 = (byte)(uVar11 + 2);
      iVar9 = 1 << (bVar16 & 0x1f);
      nmemb = 1;
      uVar21 = (xsize + iVar9) - 1U >> (bVar16 & 0x1f);
      bVar16 = bVar16 & 0x1f;
      uVar23 = (ysize + iVar9) - 1U >> bVar16;
      iVar9 = DecodeImageStream(uVar21,uVar23,0,dec,&local_88);
      if (iVar9 == 0) {
        __s = (void *)(ulong)(0 >> bVar16);
LAB_00110554:
        local_b8 = (HTreeGroup *)0x0;
        ptr = (HuffmanCode *)0x0;
        code_lengths = (int *)0x0;
        bVar6 = true;
        goto LAB_00110567;
      }
      uVar21 = uVar21 * uVar23;
      (dec->hdr_).huffman_subsample_bits_ = uVar11 + 2;
      if (0 < (int)uVar21) {
        nmemb = 1;
        uVar14 = 0;
        do {
          uVar2 = *(ushort *)((long)local_88 + uVar14 * 4 + 1);
          local_88[uVar14] = (uint)uVar2;
          if ((uint)nmemb <= (uint)uVar2) {
            nmemb = (uint64_t)(uVar2 + 1);
          }
          uVar14 = uVar14 + 1;
        } while (uVar21 != uVar14);
      }
      if (((uint)nmemb < 0x3e9) && ((int)(uint)nmemb <= xsize * ysize)) {
        __s = (void *)(ulong)(0 >> bVar16);
        uVar14 = nmemb;
      }
      else {
        __s = WebPSafeMalloc(nmemb,4);
        if (__s == (void *)0x0) {
          dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
          __s = (void *)0x0;
          goto LAB_00110554;
        }
        memset(__s,0xff,nmemb << 2);
        if ((int)uVar21 < 1) {
          uVar14 = 0;
        }
        else {
          uVar18 = 0;
          uVar17 = 0;
          do {
            uVar23 = *(uint *)((long)__s + (ulong)local_88[uVar18] * 4);
            uVar22 = (ulong)uVar23;
            uVar14 = uVar17;
            if (uVar23 == 0xffffffff) {
              *(int *)((long)__s + (ulong)local_88[uVar18] * 4) = (int)uVar17;
              uVar14 = (ulong)((int)uVar17 + 1);
              uVar22 = uVar17;
            }
            local_88[uVar18] = (uint32_t)uVar22;
            uVar18 = uVar18 + 1;
            uVar17 = uVar14;
          } while (uVar21 != uVar18);
        }
      }
    }
    bVar6 = true;
    code_lengths = (int *)0x0;
    if ((dec->br_).eos_ == 0) {
      iVar9 = 1 << ((byte)uVar7 & 0x1f);
      lVar15 = 0;
      uVar21 = 0;
      do {
        iVar10 = 0;
        if (lVar15 == 0) {
          iVar10 = iVar9;
        }
        if ((int)uVar7 < 1) {
          iVar10 = 0;
        }
        uVar23 = iVar10 + (uint)*(ushort *)((long)kAlphabetSize + lVar15);
        if ((int)uVar23 < (int)uVar21) {
          uVar23 = uVar21;
        }
        uVar21 = uVar23;
        lVar15 = lVar15 + 2;
      } while (lVar15 != 10);
      local_80 = CONCAT44(local_80._4_4_,iVar9);
      local_68 = uVar14;
      code_lengths = (int *)WebPSafeCalloc((ulong)uVar21,4);
      iVar9 = (int)local_68;
      ptr = (HuffmanCode *)WebPSafeMalloc((ulong)uVar1 * (long)(int)local_68,4);
      local_b8 = VP8LHtreeGroupsNew(iVar9);
      if (((local_b8 == (HTreeGroup *)0x0) || (code_lengths == (int *)0x0)) ||
         (ptr == (HuffmanCode *)0x0)) {
        dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
        bVar6 = true;
      }
      else {
        local_50 = &local_b8->packed_table[0].value;
        uVar19 = 0;
        table = ptr;
        local_78 = __s;
        local_40 = nmemb;
        do {
          iVar9 = (int)uVar19;
          local_70 = uVar19;
          if ((__s == (void *)0x0) || (iVar9 = *(int *)((long)__s + uVar19 * 4), iVar9 != -1)) {
            local_48 = (long)iVar9 * 0x238;
            local_60 = local_b8 + iVar9;
            uVar21 = 1;
            uVar14 = 0;
            iVar10 = 0;
            iVar9 = 0;
            do {
              iVar12 = 0;
              if (uVar14 == 0) {
                iVar12 = (int)local_80;
              }
              uVar1 = kAlphabetSize[uVar14];
              local_60->htrees[uVar14] = table;
              if ((int)uVar7 < 1) {
                iVar12 = 0;
              }
              uVar23 = iVar12 + (uint)uVar1;
              iVar12 = ReadHuffmanCode(uVar23,dec,code_lengths,table);
              __s = local_78;
              if (iVar12 == 0) goto LAB_00110562;
              if (uVar21 == 0) {
                bVar16 = table->bits;
                uVar21 = 0;
              }
              else {
                bVar16 = table->bits;
                if ((uVar14 & 3) == 0) {
                  uVar21 = 1;
                }
                else {
                  uVar21 = (uint)(bVar16 == 0);
                }
              }
              iVar9 = iVar9 + (uint)bVar16;
              table = table + iVar12;
              if (uVar14 == 4) break;
              iVar12 = *code_lengths;
              if (1 < uVar23) {
                uVar17 = 1;
                do {
                  if (iVar12 < code_lengths[uVar17]) {
                    iVar12 = code_lengths[uVar17];
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar23 != uVar17);
              }
              iVar10 = iVar10 + iVar12;
              uVar14 = uVar14 + 1;
            } while (uVar14 != 5);
            local_60->is_trivial_literal = uVar21;
            local_60->is_trivial_code = 0;
            if (uVar21 != 0) {
              uVar21 = CONCAT22(local_60->htrees[1]->value,local_60->htrees[2]->value) |
                       (uint)local_60->htrees[3]->value << 0x18;
              local_60->literal_arb = uVar21;
              if ((iVar9 == 0) && (uVar1 = local_60->htrees[0]->value, uVar1 < 0x100)) {
                local_60->is_trivial_code = 1;
                local_60->use_packed_table = 0;
                local_60->literal_arb = uVar21 | (uint)uVar1 << 8;
                goto LAB_00110439;
              }
            }
            local_60->use_packed_table = (uint)(iVar10 < 6);
            if (iVar10 < 6) {
              pHVar5 = local_60->htrees[0];
              lVar15 = 0;
              do {
                bVar16 = pHVar5[lVar15].bits;
                uVar1 = pHVar5[lVar15].value;
                if (uVar1 < 0x100) {
                  *(uint *)((long)local_50 + lVar15 * 8 + local_48 + -4) = (uint)bVar16;
                  uVar21 = (uint)lVar15 >> (bVar16 & 0x1f);
                  *(uint *)((long)local_50 + lVar15 * 8 + local_48) = (uint)uVar1 << 8;
                  HVar3 = local_60->htrees[1][uVar21];
                  iVar9 = ((uint)HVar3 & 0xff) + (uint)bVar16;
                  *(int *)((long)local_50 + lVar15 * 8 + local_48 + -4) = iVar9;
                  uVar23 = (uint)HVar3 & 0xffff0000 | (uint)uVar1 << 8;
                  *(uint *)((long)local_50 + lVar15 * 8 + local_48) = uVar23;
                  uVar21 = uVar21 >> (HVar3.bits & 0x1f);
                  HVar3 = local_60->htrees[2][uVar21];
                  iVar9 = ((uint)HVar3 & 0xff) + iVar9;
                  *(int *)((long)local_50 + lVar15 * 8 + local_48 + -4) = iVar9;
                  uVar23 = (uint)HVar3 >> 0x10 | uVar23;
                  *(uint *)((long)local_50 + lVar15 * 8 + local_48) = uVar23;
                  HVar3 = local_60->htrees[3][uVar21 >> (HVar3.bits & 0x1f)];
                  *(uint *)((long)local_50 + lVar15 * 8 + local_48 + -4) =
                       ((uint)HVar3 & 0xff) + iVar9;
                  *(uint *)((long)local_50 + lVar15 * 8 + local_48) =
                       ((uint)HVar3 & 0xff0000) << 8 | uVar23;
                }
                else {
                  *(uint *)((long)local_50 + lVar15 * 8 + local_48 + -4) = bVar16 | 0x100;
                  *(uint *)((long)local_50 + lVar15 * 8 + local_48) = (uint)uVar1;
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 != 0x40);
            }
          }
          else {
            lVar15 = 0;
            do {
              iVar9 = 0;
              if (lVar15 == 0) {
                iVar9 = (int)local_80;
              }
              if ((int)uVar7 < 1) {
                iVar9 = 0;
              }
              iVar9 = ReadHuffmanCode(iVar9 + (uint)*(ushort *)((long)kAlphabetSize + lVar15),dec,
                                      code_lengths,(HuffmanCode *)0x0);
              if (iVar9 == 0) goto LAB_00110562;
              lVar15 = lVar15 + 2;
            } while (lVar15 != 10);
          }
LAB_00110439:
          uVar19 = local_70 + 1;
        } while (uVar19 != local_40);
        (dec->hdr_).huffman_image_ = local_88;
        (dec->hdr_).num_htree_groups_ = (int)local_68;
        (dec->hdr_).htree_groups_ = local_b8;
        (dec->hdr_).huffman_tables_ = ptr;
        bVar6 = false;
      }
    }
    else {
      ptr = (HuffmanCode *)0x0;
      local_b8 = (HTreeGroup *)0x0;
    }
    goto LAB_00110567;
  }
  do {
    while( true ) {
      uVar7 = VP8LReadBits(br_00,1);
      if (uVar7 == 0) goto LAB_0010ff22;
      iVar9 = dec->next_transform_;
      VVar8 = VP8LReadBits(br_00,2);
      VVar20 = VP8_STATUS_BITSTREAM_ERROR;
      if ((dec->transforms_seen_ >> (VVar8 & 0x1f) & 1) != 0) goto LAB_0011059c;
      pVVar24 = dec->transforms_ + iVar9;
      dec->transforms_seen_ = dec->transforms_seen_ | 1 << ((byte)VVar8 & 0x1f);
      pVVar24->type_ = VVar8;
      pVVar24->xsize_ = xsize;
      pVVar24->ysize_ = ysize;
      decoded_data_00 = &pVVar24->data_;
      pVVar24->data_ = (uint32_t *)0x0;
      dec->next_transform_ = dec->next_transform_ + 1;
      if (VVar8 < SUBTRACT_GREEN) break;
      if (VVar8 == COLOR_INDEXING_TRANSFORM) {
        uVar7 = VP8LReadBits(br_00,8);
        iVar9 = uVar7 + 1;
        uVar21 = 0;
        if ((iVar9 < 0x11) && (uVar21 = 1, iVar9 < 5)) {
          uVar21 = 2 < iVar9 ^ 3;
        }
        xsize = (pVVar24->xsize_ + (1 << (sbyte)uVar21)) - 1U >> (sbyte)uVar21;
        pVVar24->bits_ = uVar21;
        iVar10 = DecodeImageStream(iVar9,1,0,dec,decoded_data_00);
        if (iVar10 == 0) goto LAB_0011059c;
        local_80 = 8L >> ((byte)pVVar24->bits_ & 0x3f);
        puVar13 = (uint32_t *)WebPSafeMalloc(1L << ((byte)local_80 & 0x3f),4);
        if (puVar13 == (uint32_t *)0x0) goto LAB_0011059c;
        puVar4 = *decoded_data_00;
        *puVar13 = *puVar4;
        uVar14 = 4;
        if (1 < iVar9) {
          uVar14 = (ulong)(uint)(iVar9 * 4);
          if (iVar9 * 4 < 6) {
            uVar14 = 5;
          }
          uVar17 = 4;
          do {
            *(char *)((long)puVar13 + uVar17) =
                 *(char *)((long)puVar13 + (uVar17 - 4)) + *(char *)((long)puVar4 + uVar17);
            uVar17 = uVar17 + 1;
          } while (uVar14 != uVar17);
        }
        uVar21 = 4 << ((byte)local_80 & 0x1f);
        if ((uint)uVar14 < uVar21) {
          memset((void *)((long)puVar13 + uVar14),0,(ulong)(uVar21 + ~(uint)uVar14) + 1);
        }
        WebPSafeFree(*decoded_data_00);
        *decoded_data_00 = puVar13;
      }
    }
    uVar7 = VP8LReadBits(br_00,3);
    bVar16 = (byte)(uVar7 + 2);
    pVVar24->bits_ = uVar7 + 2;
    uVar21 = ~(-1 << (bVar16 & 0x1f));
    iVar9 = DecodeImageStream(pVVar24->xsize_ + uVar21 >> (bVar16 & 0x1f),
                              uVar21 + pVVar24->ysize_ >> (bVar16 & 0x1f),0,dec,decoded_data_00);
  } while (iVar9 != 0);
LAB_0011059c:
  dec->status_ = VVar20;
  puVar13 = (uint32_t *)0x0;
  goto LAB_001105a1;
LAB_00110562:
  bVar6 = true;
LAB_00110567:
  WebPSafeFree(code_lengths);
  WebPSafeFree(__s);
  if (bVar6) {
    WebPSafeFree(local_88);
    WebPSafeFree(ptr);
    VP8LHtreeGroupsFree(local_b8);
    VVar20 = VP8_STATUS_BITSTREAM_ERROR;
    goto LAB_0011059c;
  }
  if ((int)uVar7 < 1) {
    local_58->color_cache_size_ = 0;
  }
  else {
    VVar20 = VP8_STATUS_OUT_OF_MEMORY;
    (dec->hdr_).color_cache_size_ = 1 << ((byte)uVar7 & 0x1f);
    iVar9 = VP8LColorCacheInit(&(dec->hdr_).color_cache_,uVar7);
    if (iVar9 == 0) goto LAB_0011059c;
  }
  iVar9 = (dec->hdr_).huffman_subsample_bits_;
  bVar16 = (byte)iVar9;
  VVar20 = VP8_STATUS_OUT_OF_MEMORY;
  dec->width_ = xsize;
  dec->height_ = ysize;
  (dec->hdr_).huffman_xsize_ = ((1 << (bVar16 & 0x1f)) + xsize) - 1U >> (bVar16 & 0x1f);
  (dec->hdr_).huffman_mask_ = -(uint)(iVar9 == 0) | ~(-1 << (bVar16 & 0x1f));
  if (is_level0 != 0) {
    dec->state_ = READ_HDR;
    puVar13 = (uint32_t *)0x0;
LAB_00110666:
    if (local_38 != (uint32_t **)0x0) {
      *local_38 = puVar13;
    }
    dec->last_pixel_ = 0;
    iVar9 = 1;
    if (is_level0 != 0) {
      return 1;
    }
    goto LAB_001105ab;
  }
  puVar13 = (uint32_t *)WebPSafeMalloc((long)ysize * (long)xsize,4);
  if (puVar13 == (uint32_t *)0x0) goto LAB_0011059c;
  iVar9 = DecodeImageData(dec,puVar13,xsize,ysize,ysize,(ProcessRowsFunc)0x0);
  if ((iVar9 != 0) && ((dec->br_).eos_ == 0)) goto LAB_00110666;
LAB_001105a1:
  WebPSafeFree(puVar13);
  iVar9 = 0;
LAB_001105ab:
  ClearMetadata(local_58);
  return iVar9;
}

Assistant:

static int DecodeImageStream(int xsize, int ysize,
                             int is_level0,
                             VP8LDecoder* const dec,
                             uint32_t** const decoded_data) {
  int ok = 1;
  int transform_xsize = xsize;
  int transform_ysize = ysize;
  VP8LBitReader* const br = &dec->br_;
  VP8LMetadata* const hdr = &dec->hdr_;
  uint32_t* data = NULL;
  int color_cache_bits = 0;

  // Read the transforms (may recurse).
  if (is_level0) {
    while (ok && VP8LReadBits(br, 1)) {
      ok = ReadTransform(&transform_xsize, &transform_ysize, dec);
    }
  }

  // Color cache
  if (ok && VP8LReadBits(br, 1)) {
    color_cache_bits = VP8LReadBits(br, 4);
    ok = (color_cache_bits >= 1 && color_cache_bits <= MAX_CACHE_BITS);
    if (!ok) {
      dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
      goto End;
    }
  }

  // Read the Huffman codes (may recurse).
  ok = ok && ReadHuffmanCodes(dec, transform_xsize, transform_ysize,
                              color_cache_bits, is_level0);
  if (!ok) {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    goto End;
  }

  // Finish setting up the color-cache
  if (color_cache_bits > 0) {
    hdr->color_cache_size_ = 1 << color_cache_bits;
    if (!VP8LColorCacheInit(&hdr->color_cache_, color_cache_bits)) {
      dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
      ok = 0;
      goto End;
    }
  } else {
    hdr->color_cache_size_ = 0;
  }
  UpdateDecoder(dec, transform_xsize, transform_ysize);

  if (is_level0) {   // level 0 complete
    dec->state_ = READ_HDR;
    goto End;
  }

  {
    const uint64_t total_size = (uint64_t)transform_xsize * transform_ysize;
    data = (uint32_t*)WebPSafeMalloc(total_size, sizeof(*data));
    if (data == NULL) {
      dec->status_ = VP8_STATUS_OUT_OF_MEMORY;
      ok = 0;
      goto End;
    }
  }

  // Use the Huffman trees to decode the LZ77 encoded data.
  ok = DecodeImageData(dec, data, transform_xsize, transform_ysize,
                       transform_ysize, NULL);
  ok = ok && !br->eos_;

 End:
  if (!ok) {
    WebPSafeFree(data);
    ClearMetadata(hdr);
  } else {
    if (decoded_data != NULL) {
      *decoded_data = data;
    } else {
      // We allocate image data in this function only for transforms. At level 0
      // (that is: not the transforms), we shouldn't have allocated anything.
      assert(data == NULL);
      assert(is_level0);
    }
    dec->last_pixel_ = 0;  // Reset for future DECODE_DATA_FUNC() calls.
    if (!is_level0) ClearMetadata(hdr);  // Clean up temporary data behind.
  }
  return ok;
}